

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char **argv_00;
  pointer pSVar1;
  pointer pHVar2;
  __type _Var3;
  int iVar4;
  int iVar5;
  Header *pHVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *pcVar8;
  ostream *poVar9;
  invalid_argument *this;
  code *check;
  int p;
  char *pcVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int part;
  char **local_f0;
  int local_e4;
  char *local_e0;
  SetAttrVector attrs;
  int i;
  char *local_b8;
  int local_ac;
  undefined8 local_a8;
  MultiPartInputFile in;
  MultiPartOutputFile out;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  OutputPart outPart;
  InputPart inPart;
  
  if (argc < 2) {
    usageMessage((ostream *)&std::cerr,*argv,false);
    return 1;
  }
  attrs.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  part = -1;
  attrs.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  attrs.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  i = 1;
  local_b8 = (char *)0x0;
  local_e0 = (char *)0x0;
  local_f0 = argv;
LAB_00104e4d:
  do {
    iVar5 = i;
    argv_00 = local_f0;
    if (argc <= i) break;
    pcVar8 = local_f0[i];
    pcVar10 = pcVar8;
    iVar4 = strcmp(pcVar8,"-part");
    if (iVar4 != 0) {
      pcVar10 = pcVar8 + 1;
      iVar4 = strcmp(pcVar8,"-chromaticities");
      if (iVar4 == 0) {
        getChromaticities(pcVar10,argc,local_f0,&i,part,&attrs);
        goto LAB_00104e4d;
      }
      iVar4 = strcmp(pcVar8,"-whiteLuminance");
      if (iVar4 == 0) {
LAB_001051cb:
        getFloat(pcVar10,argc,local_f0,&i,part,&attrs,(_func_void_char_ptr_float *)0x0);
        goto LAB_00104e4d;
      }
      iVar4 = strcmp(pcVar8,"-adoptedNeutral");
      if (iVar4 == 0) {
LAB_00105211:
        getV2f(pcVar10,argc,local_f0,&i,part,&attrs,(_func_void_char_ptr_V2f_ptr *)0x0);
        goto LAB_00104e4d;
      }
      iVar4 = strcmp(pcVar8,"-renderingTransform");
      if ((iVar4 == 0) || (iVar4 = strcmp(pcVar8,"-lookModTransform"), iVar4 == 0)) {
LAB_001051ee:
        getString(pcVar10,argc,local_f0,&i,part,&attrs,(_func_void_char_ptr_char_ptr *)0x0);
        goto LAB_00104e4d;
      }
      iVar4 = strcmp(pcVar8,"-xDensity");
      check = isPositive;
      if (iVar4 != 0) {
        iVar4 = strcmp(pcVar8,"-owner");
        if ((iVar4 == 0) || (iVar4 = strcmp(pcVar8,"-comments"), iVar4 == 0)) goto LAB_001051ee;
        iVar4 = strcmp(pcVar8,"-capDate");
        if (iVar4 == 0) {
          getString(pcVar10,argc,local_f0,&i,part,&attrs,isDate);
          goto LAB_00104e4d;
        }
        iVar4 = strcmp(pcVar8,"-utcOffset");
        if ((((iVar4 == 0) || (iVar4 = strcmp(pcVar8,"-longitude"), iVar4 == 0)) ||
            (iVar4 = strcmp(pcVar8,"-latitude"), iVar4 == 0)) ||
           (iVar4 = strcmp(pcVar8,"-altitude"), iVar4 == 0)) goto LAB_001051cb;
        iVar4 = strcmp(pcVar8,"-focus");
        if (iVar4 == 0) {
          getPosFloatOrInf(pcVar10,argc,local_f0,&i,part,&attrs);
          goto LAB_00104e4d;
        }
        iVar4 = strcmp(pcVar8,"-expTime");
        check = isPositive;
        if (iVar4 != 0) {
          iVar4 = strcmp(pcVar8,"-aperture");
          check = isPositive;
          if (iVar4 != 0) {
            iVar4 = strcmp(pcVar8,"-isoSpeed");
            check = isPositive;
            if (iVar4 != 0) {
              iVar4 = strcmp(pcVar8,"-envmap");
              if (iVar4 == 0) {
                getEnvmap(pcVar10,argc,local_f0,&i,part,&attrs);
                goto LAB_00104e4d;
              }
              iVar4 = strcmp(pcVar8,"-framesPerSecond");
              if (iVar4 == 0) {
                getRational(pcVar10,argc,local_f0,&i,part,&attrs,
                            (_func_void_char_ptr_Rational_ptr *)0x0);
                goto LAB_00104e4d;
              }
              iVar4 = strcmp(pcVar8,"-keyCode");
              if (iVar4 == 0) {
                getKeyCode(pcVar10,argc,local_f0,&i,part,&attrs);
                goto LAB_00104e4d;
              }
              iVar4 = strcmp(pcVar8,"-timeCode");
              if (iVar4 == 0) {
                getTimeCode(pcVar10,argc,local_f0,&i,part,&attrs);
                goto LAB_00104e4d;
              }
              iVar4 = strcmp(pcVar8,"-wrapmodes");
              if (iVar4 == 0) goto LAB_001051ee;
              iVar4 = strcmp(pcVar8,"-pixelAspectRatio");
              check = isPositive;
              if (iVar4 != 0) {
                iVar4 = strcmp(pcVar8,"-screenWindowWidth");
                check = isNonNegative;
                if (iVar4 != 0) {
                  iVar4 = strcmp(pcVar8,"-screenWindowCenter");
                  if (iVar4 == 0) goto LAB_00105211;
                  iVar4 = strcmp(pcVar8,"-string");
                  if (iVar4 == 0) {
                    getNameAndString(argc,local_f0,&i,part,&attrs);
                  }
                  else {
                    iVar4 = strcmp(pcVar8,"-float");
                    if (iVar4 == 0) {
                      getNameAndFloat(argc,local_f0,&i,part,&attrs);
                      goto LAB_00104e4d;
                    }
                    iVar4 = strcmp(pcVar8,"-int");
                    if (iVar4 != 0) {
                      if ((((*pcVar8 == '-') && (*pcVar10 == 'h')) && (pcVar8[2] == '\0')) ||
                         (iVar4 = strcmp(pcVar8,"--help"), iVar4 == 0)) {
                        usageMessage((ostream *)&std::cout,"exrstdattr",true);
                      }
                      else {
                        iVar4 = strcmp(pcVar8,"--version");
                        if (iVar4 != 0) {
                          if (local_e0 == (char *)0x0) {
                            local_e0 = pcVar8;
                            pcVar8 = local_b8;
                          }
                          local_b8 = pcVar8;
                          i = iVar5 + 1;
                          goto LAB_00104e4d;
                        }
                        pcVar8 = (char *)Imf_3_2::getLibraryVersion();
                        poVar9 = std::operator<<((ostream *)&std::cout,"exrstdattr (OpenEXR) ");
                        std::operator<<(poVar9,"3.2.0");
                        iVar5 = strcmp(pcVar8,"3.2.0");
                        if (iVar5 != 0) {
                          poVar9 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
                          poVar9 = std::operator<<(poVar9,pcVar8);
                          std::operator<<(poVar9,")");
                        }
                        poVar9 = std::operator<<((ostream *)&std::cout," https://openexr.com");
                        std::endl<char,std::char_traits<char>>(poVar9);
                        poVar9 = std::operator<<((ostream *)&std::cout,
                                                 "Copyright (c) Contributors to the OpenEXR Project"
                                                );
                        std::endl<char,std::char_traits<char>>(poVar9);
                        poVar9 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause");
                        std::endl<char,std::char_traits<char>>(poVar9);
                      }
                      local_e4 = 0;
                      goto LAB_001056c0;
                    }
                    getNameAndInt(argc,local_f0,&i,part,&attrs);
                  }
                  goto LAB_00104e4d;
                }
              }
            }
          }
        }
      }
      getFloat(pcVar10,argc,local_f0,&i,part,&attrs,check);
      goto LAB_00104e4d;
    }
    getPart(pcVar10,argc,argv_00,&i,&part);
  } while( true );
  if (local_e0 == (char *)0x0) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Missing input filename");
  }
  else if (local_b8 == (char *)0x0) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Missing input filename");
  }
  else {
    iVar5 = strcmp(local_e0,local_b8);
    if (iVar5 != 0) {
      iVar5 = Imf_3_2::globalThreadCount();
      Imf_3_2::MultiPartInputFile::MultiPartInputFile(&in,local_e0,iVar5,true);
      local_a8 = Imf_3_2::MultiPartInputFile::parts();
      headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar5 = (int)local_a8;
      local_ac = iVar5 + -1;
      iVar12 = 0;
      iVar4 = 0;
      if (0 < iVar5) {
        iVar4 = iVar5;
      }
      local_e4 = 0;
      while (pHVar2 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                      _M_impl.super__Vector_impl_data._M_start, iVar12 != iVar4) {
        pHVar6 = (Header *)Imf_3_2::MultiPartInputFile::header((int)&in);
        Imf_3_2::Header::Header((Header *)&out,pHVar6);
        lVar13 = 0;
        for (uVar11 = 0;
            pSVar1 = attrs.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar7 = ((long)attrs.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)attrs.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x30, uVar11 < uVar7;
            uVar11 = uVar11 + 1) {
          iVar5 = *(int *)((long)&(attrs.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->part + lVar13);
          if (iVar5 == -1 || iVar5 == iVar12) {
            Imf_3_2::Header::insert
                      ((string *)&out,
                       (Attribute *)
                       ((long)&((attrs.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl
                                 .super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar13
                       ));
          }
          else if ((iVar5 < 0) || ((int)local_a8 <= iVar5)) {
            poVar9 = std::operator<<((ostream *)&std::cerr,"Invalid part number ");
            poVar9 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar9,*(int *)((long)&pSVar1->part + lVar13));
            poVar9 = std::operator<<(poVar9,". Part numbers in file ");
            poVar9 = std::operator<<(poVar9,local_e0);
            poVar9 = std::operator<<(poVar9," go from 0 to ");
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,local_ac);
            poVar9 = std::operator<<(poVar9,".");
            std::endl<char,std::char_traits<char>>(poVar9);
            local_e4 = 1;
            goto LAB_00105521;
          }
          lVar13 = lVar13 + 0x30;
        }
        std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                  (&headers,(value_type *)&out);
LAB_00105521:
        Imf_3_2::Header::~Header((Header *)&out);
        iVar12 = iVar12 + 1;
        if (uVar11 < uVar7) goto LAB_001056a9;
      }
      iVar5 = Imf_3_2::globalThreadCount();
      Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
                (&out,local_b8,pHVar2,(int)local_a8,false,iVar5);
      for (iVar5 = 0; iVar4 != iVar5; iVar5 = iVar5 + 1) {
        Imf_3_2::MultiPartInputFile::header((int)&in);
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_2::Header::type_abi_cxx11_();
        _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)Imf_3_2::SCANLINEIMAGE_abi_cxx11_);
        if (_Var3) {
          Imf_3_2::InputPart::InputPart(&inPart,&in,iVar5);
          Imf_3_2::OutputPart::OutputPart(&outPart,&out,iVar5);
          Imf_3_2::OutputPart::copyPixels((InputPart *)&outPart);
        }
        else {
          _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)Imf_3_2::TILEDIMAGE_abi_cxx11_);
          if (_Var3) {
            Imf_3_2::TiledInputPart::TiledInputPart((TiledInputPart *)&inPart,&in,iVar5);
            Imf_3_2::TiledOutputPart::TiledOutputPart((TiledOutputPart *)&outPart,&out,iVar5);
            Imf_3_2::TiledOutputPart::copyPixels((TiledInputPart *)&outPart);
          }
          else {
            _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)Imf_3_2::DEEPSCANLINE_abi_cxx11_);
            if (_Var3) {
              Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
                        ((DeepScanLineInputPart *)&inPart,&in,iVar5);
              Imf_3_2::DeepScanLineOutputPart::DeepScanLineOutputPart
                        ((DeepScanLineOutputPart *)&outPart,&out,iVar5);
              Imf_3_2::DeepScanLineOutputPart::copyPixels((DeepScanLineInputPart *)&outPart);
            }
            else {
              _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)Imf_3_2::DEEPTILE_abi_cxx11_);
              if (_Var3) {
                Imf_3_2::DeepTiledInputPart::DeepTiledInputPart
                          ((DeepTiledInputPart *)&inPart,&in,iVar5);
                Imf_3_2::DeepTiledOutputPart::DeepTiledOutputPart
                          ((DeepTiledOutputPart *)&outPart,&out,iVar5);
                Imf_3_2::DeepTiledOutputPart::copyPixels((DeepTiledInputPart *)&outPart);
              }
            }
          }
        }
      }
      Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(&out);
      local_e4 = 0;
LAB_001056a9:
      std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&headers);
      Imf_3_2::MultiPartInputFile::~MultiPartInputFile(&in);
LAB_001056c0:
      std::vector<SetAttr,_std::allocator<SetAttr>_>::~vector(&attrs);
      return local_e4;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Input and output cannot be the same file");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int
main (int argc, char** argv)
{
    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return 1;
    }

    try
    {
        const char* inFileName  = 0;
        const char* outFileName = 0;

        SetAttrVector attrs;
        int           part = -1;
        int           i    = 1;

        while (i < argc)
        {
            const char* attrName = argv[i] + 1;

            if (!strcmp (argv[i], "-part"))
            {
                getPart (attrName, argc, argv, i, part);
            }
            else if (!strcmp (argv[i], "-chromaticities"))
            {
                getChromaticities (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-whiteLuminance"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-adoptedNeutral"))
            {
                getV2f (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-renderingTransform"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-lookModTransform"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-xDensity"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-owner"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-comments"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-capDate"))
            {
                getString (attrName, argc, argv, i, part, attrs, isDate);
            }
            else if (!strcmp (argv[i], "-utcOffset"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-longitude"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-latitude"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-altitude"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-focus"))
            {
                getPosFloatOrInf (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-expTime"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-aperture"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-isoSpeed"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-envmap"))
            {
                getEnvmap (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-framesPerSecond"))
            {
                getRational (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-keyCode"))
            {
                getKeyCode (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-timeCode"))
            {
                getTimeCode (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-wrapmodes"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-pixelAspectRatio"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-screenWindowWidth"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isNonNegative);
            }
            else if (!strcmp (argv[i], "-screenWindowCenter"))
            {
                getV2f (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-string"))
            {
                getNameAndString (argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-float"))
            {
                getNameAndFloat (argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-int"))
            {
                getNameAndInt (argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
            {
                usageMessage (cout, "exrstdattr", true);
                return 0;
            }
            else if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion();
            
                cout << "exrstdattr (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp(libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
                cout << "License BSD-3-Clause" << endl;

                return 0;
            }
            else
            {
                if (inFileName == 0)
                    inFileName = argv[i];
                else
                    outFileName = argv[i];

                i += 1;
            }
        }

        if (inFileName == 0)
            throw invalid_argument("Missing input filename");
        if (outFileName == 0)
            throw invalid_argument("Missing input filename");

        if (!strcmp (inFileName, outFileName))
            throw invalid_argument("Input and output cannot be the same file");

        //
        // Load the headers from the input file
        // and add attributes to the headers.
        //

        MultiPartInputFile in (inFileName);
        int                numParts = in.parts ();
        vector<Header>     headers;

        for (int part = 0; part < numParts; ++part)
        {
            Header h = in.header (part);

            for (size_t i = 0; i < attrs.size (); ++i)
            {
                const SetAttr& attr = attrs[i];

                if (attr.part == -1 || attr.part == part)
                {
                    h.insert (attr.name, *attr.attr);
                }
                else if (attr.part < 0 || attr.part >= numParts)
                {
                    cerr << "Invalid part number " << attr.part
                         << ". "
                            "Part numbers in file "
                         << inFileName
                         << " "
                            "go from 0 to "
                         << numParts - 1 << "." << endl;

                    return 1;
                }
            }

            headers.push_back (h);
        }

        //
        // Crete an output file with the modified headers,
        // and copy the pixels from the input file to the
        // output file.
        //

        MultiPartOutputFile out (outFileName, &headers[0], numParts);

        for (int p = 0; p < numParts; ++p)
        {
            const Header& h    = in.header (p);
            const string& type = h.type ();

            if (type == SCANLINEIMAGE)
            {
                InputPart  inPart (in, p);
                OutputPart outPart (out, p);
                outPart.copyPixels (inPart);
            }
            else if (type == TILEDIMAGE)
            {
                TiledInputPart  inPart (in, p);
                TiledOutputPart outPart (out, p);
                outPart.copyPixels (inPart);
            }
            else if (type == DEEPSCANLINE)
            {
                DeepScanLineInputPart  inPart (in, p);
                DeepScanLineOutputPart outPart (out, p);
                outPart.copyPixels (inPart);
            }
            else if (type == DEEPTILE)
            {
                DeepTiledInputPart  inPart (in, p);
                DeepTiledOutputPart outPart (out, p);
                outPart.copyPixels (inPart);
            }
        }
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }

    return 0;
}